

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InitTermTest.cpp
# Opt level: O0

int TestInit4SAX2(char *xmlFile,bool gDoNamespaces,bool gDoSchema,bool gSchemaFullChecking,
                 Teststate theState)

{
  bool bVar1;
  ostream *this;
  OutOfMemoryException *anon_var_0;
  XMLException *toCatch;
  DOMException *toCatch_1;
  undefined1 local_98 [7];
  bool errorOccurred;
  InitTermTestErrorHandler errorHandler;
  XMLCh *fullSchemaCheckFeature;
  XMLCh *handleMultipleImportsFeature;
  XMLCh *doSchemaFeature;
  XMLCh *doNamespaceFeature;
  SAX2XMLReader *parser;
  XMLException *toCatch_3;
  XMLException *toCatch_2;
  long local_30;
  long i;
  long times;
  Teststate theState_local;
  bool gSchemaFullChecking_local;
  bool gDoSchema_local;
  bool gDoNamespaces_local;
  char *xmlFile_local;
  
  if (theState != Once) {
    if (theState - Multiple < 2) {
      i = 100;
      goto LAB_00105475;
    }
    if (theState - Limit < 2) {
      i = 0x7fffffffffffffff;
      goto LAB_00105475;
    }
  }
  i = 1;
LAB_00105475:
  times._0_4_ = theState;
  times._5_1_ = gSchemaFullChecking;
  times._6_1_ = gDoSchema;
  times._7_1_ = gDoNamespaces;
  _theState_local = xmlFile;
  for (local_30 = 0; local_30 < i; local_30 = local_30 + 1) {
    xercesc_4_0::XMLPlatformUtils::Initialize
              ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
               (MemoryManager *)0x0);
  }
  if ((Teststate)times == ExceedLimit) {
    xercesc_4_0::XMLPlatformUtils::Initialize
              ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
               (MemoryManager *)0x0);
  }
  doNamespaceFeature =
       (XMLCh *)xercesc_4_0::XMLReaderFactory::createXMLReader
                          (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,(XMLGrammarPool *)0x0);
  doSchemaFeature =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("http://xml.org/sax/features/namespaces",
                           xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)doNamespaceFeature + 0x60))
            (doNamespaceFeature,doSchemaFeature,times._7_1_ & 1);
  handleMultipleImportsFeature =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("http://apache.org/xml/features/validation/schema",
                           xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)doNamespaceFeature + 0x60))
            (doNamespaceFeature,handleMultipleImportsFeature,times._6_1_ & 1);
  fullSchemaCheckFeature =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("http://apache.org/xml/features/validation/schema/handle-multiple-imports"
                           ,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)doNamespaceFeature + 0x60))(doNamespaceFeature,fullSchemaCheckFeature,1);
  errorHandler._8_8_ =
       xercesc_4_0::XMLString::transcode
                 ("http://apache.org/xml/features/validation/schema-full-checking",
                  xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)doNamespaceFeature + 0x60))
            (doNamespaceFeature,errorHandler._8_8_,times._5_1_ & 1);
  xercesc_4_0::XMLString::release(&doSchemaFeature,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::release
            (&handleMultipleImportsFeature,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::release
            (&fullSchemaCheckFeature,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::release
            ((wchar16 **)&errorHandler.fSawErrors,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  InitTermTestErrorHandler::InitTermTestErrorHandler((InitTermTestErrorHandler *)local_98);
  (**(code **)(*(long *)doNamespaceFeature + 0x58))
            (doNamespaceFeature,(InitTermTestErrorHandler *)local_98);
  InitTermTestErrorHandler::resetErrors((InitTermTestErrorHandler *)local_98);
  (**(code **)(*(long *)doNamespaceFeature + 0x80))(doNamespaceFeature,_theState_local);
  bVar1 = InitTermTestErrorHandler::getSawErrors((InitTermTestErrorHandler *)local_98);
  if (bVar1) {
    this = std::operator<<((ostream *)&std::cout,"\nErrors occurred, no output available\n");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  if (doNamespaceFeature != (XMLCh *)0x0) {
    (**(code **)(*(long *)doNamespaceFeature + 8))();
  }
  for (local_30 = 0; local_30 < i; local_30 = local_30 + 1) {
    xercesc_4_0::XMLPlatformUtils::Terminate();
  }
  if (((Teststate)times == ExceedLimit) || ((Teststate)times == UnEven)) {
    xercesc_4_0::XMLPlatformUtils::Terminate();
  }
  if (bVar1) {
    xmlFile_local._4_4_ = 4;
  }
  else {
    xmlFile_local._4_4_ = 0;
  }
  InitTermTestErrorHandler::~InitTermTestErrorHandler((InitTermTestErrorHandler *)local_98);
  return xmlFile_local._4_4_;
}

Assistant:

int TestInit4SAX2(const char* xmlFile, bool gDoNamespaces, bool gDoSchema, bool gSchemaFullChecking, Teststate theState)
{
    TESTINITPRE;
    SAX2XMLReader* parser = XMLReaderFactory::createXMLReader();

    XMLCh* doNamespaceFeature = XMLString::transcode("http://xml.org/sax/features/namespaces");
    parser->setFeature(doNamespaceFeature, gDoNamespaces);

    XMLCh* doSchemaFeature = XMLString::transcode("http://apache.org/xml/features/validation/schema");
    parser->setFeature(doSchemaFeature, gDoSchema);

    XMLCh* handleMultipleImportsFeature = XMLString::transcode("http://apache.org/xml/features/validation/schema/handle-multiple-imports");
    parser->setFeature(handleMultipleImportsFeature, true);

    XMLCh* fullSchemaCheckFeature = XMLString::transcode("http://apache.org/xml/features/validation/schema-full-checking");
    parser->setFeature(fullSchemaCheckFeature, gSchemaFullChecking);

    XMLString::release(&doNamespaceFeature);
    XMLString::release(&doSchemaFeature);
    XMLString::release(&handleMultipleImportsFeature);
    XMLString::release(&fullSchemaCheckFeature);

    TESTINITPOST;
}